

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

void update_search_state(InterModeSearchState *search_state,RD_STATS *best_rd_stats_dst,
                        PICK_MODE_CONTEXT *ctx,RD_STATS *new_best_rd_stats,
                        RD_STATS *new_best_rd_stats_y,RD_STATS *new_best_rd_stats_uv,
                        THR_MODES new_best_mode,MACROBLOCK *x,int txfm_search_done)

{
  void *__src;
  int iVar1;
  int iVar2;
  void *in_RCX;
  long in_RDX;
  void *in_RSI;
  undefined8 *in_RDI;
  int *in_R8;
  undefined4 *in_R9;
  byte in_stack_00000008;
  long in_stack_00000010;
  TxfmSearchInfo *txfm_info;
  int skip_txfm;
  int skip_ctx;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  bool local_52;
  byte local_51;
  
  __src = (void *)**(undefined8 **)(in_stack_00000010 + 0x2058);
  iVar1 = av1_get_skip_txfm_context((MACROBLOCKD *)(in_stack_00000010 + 0x1a0));
  local_51 = 0;
  if (*(char *)((long)__src + 0x90) != '\0') {
    iVar2 = is_mode_intra(av1_mode_defs[in_stack_00000008].mode);
    local_51 = iVar2 != 0 ^ 0xff;
  }
  *in_RDI = *(undefined8 *)((long)in_RCX + 0x10);
  *(byte *)(in_RDI + 0x1b) = in_stack_00000008;
  memcpy(in_RSI,in_RCX,0x28);
  memcpy(in_RDI + 3,__src,0xb0);
  *(uint *)((long)in_RDI + 0xd4) = (uint)(local_51 & 1);
  *(uint *)(in_RDI + 0x1a) = (uint)*(byte *)((long)in_RCX + 0x20);
  if ((int)txfm_info != 0) {
    local_52 = *(char *)((long)in_RCX + 0x20) != '\0' || (local_51 & 1) != 0;
    *(int *)(in_RDI + 0x19) =
         *in_R8 + *(int *)(in_stack_00000010 + 0x8c80 + (long)iVar1 * 8 +
                          (long)(int)(uint)local_52 * 4);
    *(undefined4 *)((long)in_RDI + 0xcc) = *in_R9;
  }
  memcpy(in_RDI + 0x64c,in_R8,0x28);
  memcpy(*(void **)(in_RDX + 0x118),(void *)(in_stack_00000010 + 0x24e09),
         (long)*(int *)(in_RDX + 0x1a0));
  memcpy(*(void **)(in_RDX + 0x198),*(void **)(in_stack_00000010 + 0x2088),
         (long)*(int *)(in_RDX + 0x1a0));
  return;
}

Assistant:

static inline void update_search_state(
    InterModeSearchState *search_state, RD_STATS *best_rd_stats_dst,
    PICK_MODE_CONTEXT *ctx, const RD_STATS *new_best_rd_stats,
    const RD_STATS *new_best_rd_stats_y, const RD_STATS *new_best_rd_stats_uv,
    THR_MODES new_best_mode, const MACROBLOCK *x, int txfm_search_done) {
  const MACROBLOCKD *xd = &x->e_mbd;
  const MB_MODE_INFO *mbmi = xd->mi[0];
  const int skip_ctx = av1_get_skip_txfm_context(xd);
  const int skip_txfm =
      mbmi->skip_txfm && !is_mode_intra(av1_mode_defs[new_best_mode].mode);
  const TxfmSearchInfo *txfm_info = &x->txfm_search_info;

  search_state->best_rd = new_best_rd_stats->rdcost;
  search_state->best_mode_index = new_best_mode;
  *best_rd_stats_dst = *new_best_rd_stats;
  search_state->best_mbmode = *mbmi;
  search_state->best_skip2 = skip_txfm;
  search_state->best_mode_skippable = new_best_rd_stats->skip_txfm;
  // When !txfm_search_done, new_best_rd_stats won't provide correct rate_y and
  // rate_uv because av1_txfm_search process is replaced by rd estimation.
  // Therefore, we should avoid updating best_rate_y and best_rate_uv here.
  // These two values will be updated when av1_txfm_search is called.
  if (txfm_search_done) {
    search_state->best_rate_y =
        new_best_rd_stats_y->rate +
        x->mode_costs.skip_txfm_cost[skip_ctx]
                                    [new_best_rd_stats->skip_txfm || skip_txfm];
    search_state->best_rate_uv = new_best_rd_stats_uv->rate;
  }
  search_state->best_y_rdcost = *new_best_rd_stats_y;
  memcpy(ctx->blk_skip, txfm_info->blk_skip,
         sizeof(txfm_info->blk_skip[0]) * ctx->num_4x4_blk);
  av1_copy_array(ctx->tx_type_map, xd->tx_type_map, ctx->num_4x4_blk);
}